

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O1

void __thiscall
capnp::anon_unknown_0::MembraneResponseHook::~MembraneResponseHook(MembraneResponseHook *this)

{
  MembranePolicy *pMVar1;
  Disposer *pDVar2;
  ResponseHook *pRVar3;
  
  pMVar1 = (this->policy).ptr;
  if (pMVar1 != (MembranePolicy *)0x0) {
    (this->policy).ptr = (MembranePolicy *)0x0;
    pDVar2 = (this->policy).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pMVar1->_vptr_MembranePolicy[-2] + (long)&pMVar1->_vptr_MembranePolicy);
  }
  pRVar3 = (this->inner).ptr;
  if (pRVar3 != (ResponseHook *)0x0) {
    (this->inner).ptr = (ResponseHook *)0x0;
    pDVar2 = (this->inner).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pRVar3->_vptr_ResponseHook[-2] + (long)&pRVar3->_vptr_ResponseHook);
  }
  ResponseHook::~ResponseHook(&this->super_ResponseHook);
  operator_delete(this,0x48);
  return;
}

Assistant:

MembraneResponseHook(
      kj::Own<ResponseHook>&& inner, kj::Own<MembranePolicy>&& policy, bool reverse)
      : inner(kj::mv(inner)), policy(kj::mv(policy)), capTable(*this->policy, reverse) {}